

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::do_remove(tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
            *this,key_type k,bool bypass_verifier)

{
  mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_00;
  unsigned_long this_01;
  bool bVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined7 in_register_00000009;
  __extent_storage<18446744073709551615UL> val1;
  node_type_counter_array *this_02;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  span<const_std::byte,_18446744073709551615UL> key;
  key_type key_00;
  uint64_t key_prefix_splits_before;
  node_type_counter_array node_counts_before;
  inode_type_counter_array shrinking_inodes_before;
  size_t mem_use_before;
  undefined1 local_b0 [8];
  inode_type_counter_array growing_inodes_before;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  size_type remove_result;
  AssertHelper local_58;
  size_t mem_use_after;
  Message local_40;
  value_type leaf_count_after;
  
  key._M_ptr = k._M_extent._M_extent_value;
  if ((int)CONCAT71(in_register_00000009,bypass_verifier) == 0) {
    key_00._M_extent._M_extent_value = (size_t)k._M_ptr;
    key_00._M_ptr = (pointer)this;
    to_ikey((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             *)&key_prefix_splits_before,key_00);
    pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             _Rb_tree<std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_std::shared_ptr<std::vector<std::byte,_std::allocator<std::byte>_>_>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ::erase(&(this->values)._M_t,(key_type *)&key_prefix_splits_before);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&node_counts_before);
    local_b0._0_4_ = 1;
    local_80._M_head_impl = pbVar2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&key_prefix_splits_before,"(remove_result)","(1)",
               (unsigned_long *)&local_80,(int *)local_b0);
    if ((char)key_prefix_splits_before != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&node_counts_before);
      goto LAB_0016ff33;
    }
    testing::Message::Message((Message *)local_b0);
    if (node_counts_before._M_elems[0] == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)node_counts_before._M_elems[0];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x121,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_b0);
    this_02 = &node_counts_before;
LAB_0017026f:
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)(node_counts_before._M_elems + 4));
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_b0._4_4_,local_b0._0_4_);
  }
  else {
LAB_0016ff33:
    this_00 = &this->test_db;
    mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::get_node_counts((node_type_counter_array *)&key_prefix_splits_before,this_00);
    growing_inodes_before._M_elems[3] = (unsigned_long)this_00;
    shrinking_inodes_before._M_elems[3] =
         mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         ::get_current_memory_use(this_00);
    local_b0._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_80,"(node_counts_before[as_i<unodb::node_type::LEAF>])","(0)",
               (unsigned_long *)&key_prefix_splits_before,(int *)local_b0);
    if (local_80._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_b0);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x127,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_b0);
LAB_0017026b:
      this_02 = (node_type_counter_array *)&remove_result;
      goto LAB_0017026f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&remove_result);
    local_b0._0_4_ = 0;
    val1._M_extent_value = (size_t)(shrinking_inodes_before._M_elems + 3);
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&local_80,"(mem_use_before)","(0)",(unsigned_long *)val1._M_extent_value,
               (int *)local_b0);
    if (local_80._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_b0);
      if (remove_result == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)remove_result;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(node_counts_before._M_elems + 4),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x128,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(node_counts_before._M_elems + 4),(Message *)local_b0);
      goto LAB_0017026b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&remove_result);
    this_01 = growing_inodes_before._M_elems[3];
    mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::get_growing_inode_counts
              ((inode_type_counter_array *)local_b0,
               (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *)growing_inodes_before._M_elems[3]);
    mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::get_shrinking_inode_counts
              ((inode_type_counter_array *)(node_counts_before._M_elems + 4),
               (mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *)this_01);
    mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
    ::get_key_prefix_splits
              ((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *)this_01);
    bVar1 = mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
            ::remove_internal((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                               *)this_01,(art_key_type)k);
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,"test_db.remove failed for ");
      key._M_extent._M_extent_value = val1._M_extent_value;
      unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                ((detail *)&std::cerr,(ostream *)k._M_ptr,key);
      std::operator<<((ostream *)&std::cerr,'\n');
      mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
      ::dump((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)this_01,(ostream *)&std::cerr);
      testing::Message::Message((Message *)&local_80);
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_80._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        return;
      }
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
      return;
    }
    if (this->parallel_test != false) {
      return;
    }
    local_58.data_ =
         (AssertHelperData *)
         mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         ::get_current_memory_use
                   ((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                     *)this_01);
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_80,"(mem_use_after)","(mem_use_before)",(unsigned_long *)&local_58
               ,shrinking_inodes_before._M_elems + 3);
    if (local_80._M_head_impl._0_1_ != (internal)0x0) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&remove_result);
      local_40.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             ::get_node_count<(unodb::node_type)0>
                       ((mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                         *)this_01);
      local_88._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT71(key_prefix_splits_before._1_7_,(char)key_prefix_splits_before) + -1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_80,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] - 1)",(unsigned_long *)&local_40
                 ,(unsigned_long *)&local_88);
      if (local_80._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        if (remove_result == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)remove_result;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&mem_use_before,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                   ,0x151,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&mem_use_before,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
        if (local_88._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_88._M_head_impl + 8))();
        }
      }
      this_02 = (node_type_counter_array *)&remove_result;
      goto LAB_00170290;
    }
    testing::Message::Message(&local_40);
    if (remove_result == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)remove_result;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x14c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,&local_40);
    this_02 = (node_type_counter_array *)&remove_result;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_40.ss_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  if ((_Base_ptr)_Var3._M_head_impl != (_Base_ptr)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
LAB_00170290:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_02);
  return;
}

Assistant:

void do_remove(key_type k, bool bypass_verifier) {
    if (!bypass_verifier) {
      const auto remove_result = values.erase(to_ikey(k));
      UNODB_ASSERT_EQ(remove_result, 1);
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto node_counts_before = test_db.get_node_counts();
    const auto mem_use_before = test_db.get_current_memory_use();
    UNODB_ASSERT_GT(node_counts_before[as_i<unodb::node_type::LEAF>], 0);
    UNODB_ASSERT_GT(mem_use_before, 0);
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      if (!test_db.remove(k)) {
        // LCOV_EXCL_START
        std::cerr << "test_db.remove failed for ";
        unodb::detail::dump_key(std::cerr, k);
        std::cerr << '\n';
        test_db.dump(std::cerr);
        FAIL();
        // LCOV_EXCL_STOP
      }
    } catch (...) {
#ifdef UNODB_DETAIL_WITH_STATS
      if (!parallel_test) {
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
      }
#endif  // UNODB_DETAIL_WITH_STATS
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    if (!parallel_test) {
      const auto mem_use_after = test_db.get_current_memory_use();
      UNODB_ASSERT_LT(mem_use_after, mem_use_before);

      const auto leaf_count_after =
          test_db.template get_node_count<::unodb::node_type::LEAF>();
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] - 1);
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }